

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_HRR_Writer.cpp
# Opt level: O0

void __thiscall OSTEI_HRR_Writer::WriteHRRFile(OSTEI_HRR_Writer *this,ostream *of,ostream *ofh)

{
  char *pcVar1;
  bool bVar2;
  RRStepType RVar3;
  RRStepType RVar4;
  size_type sVar5;
  ostream *poVar6;
  int *piVar7;
  ostream *in_RDX;
  ostream *in_RSI;
  DAM *it_3;
  iterator __end2_1;
  iterator __begin2_1;
  DAMSet *__range2_1;
  stringstream prototype_1;
  string steptypestr_1;
  RRStepType ketsteptype;
  DAM *it_2;
  iterator __end3_1;
  iterator __begin3_1;
  DAMSet *__range3_1;
  int ival_1;
  DAM *it_1;
  iterator __end3;
  iterator __begin3;
  DAMSet *__range3;
  stringstream prototype_ncartket;
  int ival;
  int ncart_ket_vals [15];
  DAM *it;
  iterator __end2;
  iterator __begin2;
  DAMSet *__range2;
  stringstream prototype;
  string steptypestr;
  RRStepType brasteptype;
  HRRDoubletStepList ketsteps;
  HRRDoubletStepList brasteps;
  DAM ketam;
  DAM braam;
  QAM finalam;
  undefined4 in_stack_ffffffffffffed18;
  int in_stack_ffffffffffffed1c;
  QAM *in_stack_ffffffffffffed20;
  undefined8 in_stack_ffffffffffffed28;
  DAM *in_stack_ffffffffffffed30;
  undefined8 in_stack_ffffffffffffed68;
  ostream *in_stack_ffffffffffffed70;
  int in_stack_ffffffffffffed78;
  int in_stack_ffffffffffffed7c;
  int iVar8;
  OSTEI_HRR_Algorithm_Base *in_stack_ffffffffffffed80;
  OSTEI_HRR_Algorithm_Base *in_stack_ffffffffffffed88;
  DAM *in_stack_ffffffffffffedc0;
  OSTEI_HRR_Algorithm_Base *in_stack_ffffffffffffedc8;
  ostream *in_stack_ffffffffffffeed8;
  ostream *in_stack_ffffffffffffeee0;
  ostream *in_stack_ffffffffffffeee8;
  ostream *in_stack_ffffffffffffeef0;
  ostream *in_stack_ffffffffffffeef8;
  OSTEI_HRR_Writer *in_stack_ffffffffffffef00;
  string local_d20 [39];
  undefined1 local_cf9 [40];
  allocator local_cd1;
  string local_cd0 [39];
  allocator local_ca9;
  string local_ca8 [32];
  string local_c88 [39];
  allocator local_c61;
  string local_c60 [32];
  string local_c40 [32];
  reference local_c20;
  _Self local_c18;
  _Self local_c10 [6];
  undefined1 local_be0 [48];
  undefined1 *local_bb0;
  allocator local_ba1;
  string local_ba0 [32];
  string local_b80 [32];
  stringstream local_b60 [16];
  ostream local_b50 [376];
  string local_9d8 [76];
  RRStepType local_98c;
  string local_988 [39];
  allocator local_961;
  string local_960 [39];
  allocator local_939;
  string local_938 [39];
  allocator local_911;
  string local_910 [39];
  allocator local_8e9;
  string local_8e8 [32];
  string local_8c8 [32];
  reference local_8a8;
  _Self local_8a0;
  _Self local_898 [6];
  undefined1 local_868 [48];
  undefined1 *local_838;
  allocator local_829;
  string local_828 [32];
  string local_808 [36];
  int local_7e4;
  string local_7e0 [39];
  allocator local_7b9;
  string local_7b8 [32];
  string local_798 [39];
  allocator local_771;
  string local_770 [32];
  string local_750 [39];
  allocator local_729;
  string local_728 [32];
  string local_708 [32];
  reference local_6e8;
  _Self local_6e0;
  _Self local_6d8 [6];
  undefined1 local_6a8 [48];
  undefined1 *local_678;
  allocator local_669;
  string local_668 [32];
  string local_648 [32];
  stringstream local_628 [16];
  ostream local_618 [380];
  int local_49c;
  int local_498 [17];
  allocator local_451;
  string local_450 [32];
  string local_430 [32];
  reference local_410;
  _Self local_408;
  _Self local_400 [6];
  undefined1 local_3d0 [48];
  undefined1 *local_3a0;
  allocator local_391;
  string local_390 [32];
  string local_370 [32];
  stringstream local_350 [16];
  ostream local_340 [376];
  string local_1c8 [76];
  RRStepType local_17c;
  vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_> local_150 [2];
  vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_> local_110;
  allocator local_f1;
  string local_f0 [79];
  allocator local_a1;
  string local_a0 [136];
  ostream *local_18;
  ostream *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  GeneratorInfoBase::FinalAM
            ((GeneratorInfoBase *)CONCAT44(in_stack_ffffffffffffed1c,in_stack_ffffffffffffed18));
  QAM::operator[](in_stack_ffffffffffffed20,in_stack_ffffffffffffed1c);
  QAM::operator[](in_stack_ffffffffffffed20,in_stack_ffffffffffffed1c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,"",&local_a1);
  DAM::DAM(in_stack_ffffffffffffed30,(int)((ulong)in_stack_ffffffffffffed28 >> 0x20),
           (int)in_stack_ffffffffffffed28,(string *)in_stack_ffffffffffffed20);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  QAM::operator[](in_stack_ffffffffffffed20,in_stack_ffffffffffffed1c);
  QAM::operator[](in_stack_ffffffffffffed20,in_stack_ffffffffffffed1c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f0,"",&local_f1);
  DAM::DAM(in_stack_ffffffffffffed30,(int)((ulong)in_stack_ffffffffffffed28 >> 0x20),
           (int)in_stack_ffffffffffffed28,(string *)in_stack_ffffffffffffed20);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  DAM::DAM((DAM *)in_stack_ffffffffffffed20,
           (DAM *)CONCAT44(in_stack_ffffffffffffed1c,in_stack_ffffffffffffed18));
  OSTEI_HRR_Algorithm_Base::GetBraSteps(in_stack_ffffffffffffedc8,in_stack_ffffffffffffedc0);
  DAM::~DAM((DAM *)0x150e94);
  DAM::DAM((DAM *)in_stack_ffffffffffffed20,
           (DAM *)CONCAT44(in_stack_ffffffffffffed1c,in_stack_ffffffffffffed18));
  OSTEI_HRR_Algorithm_Base::GetKetSteps(in_stack_ffffffffffffedc8,in_stack_ffffffffffffedc0);
  DAM::~DAM((DAM *)0x150eeb);
  sVar5 = std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>::size(&local_110);
  RVar3 = (RRStepType)((ulong)in_stack_ffffffffffffed68 >> 0x20);
  if (sVar5 != 0) {
    DAM::DAM((DAM *)in_stack_ffffffffffffed20,
             (DAM *)CONCAT44(in_stack_ffffffffffffed1c,in_stack_ffffffffffffed18));
    RVar3 = OSTEI_HRR_Algorithm_Base::GetBraRRStep
                      (in_stack_ffffffffffffed80,
                       (DAM *)CONCAT44(in_stack_ffffffffffffed7c,in_stack_ffffffffffffed78));
    DAM::~DAM((DAM *)0x150f58);
    local_17c = RVar3;
    RRStepTypeToStr_abi_cxx11_((RRStepType)((ulong)in_stack_ffffffffffffed68 >> 0x20));
    std::operator<<(local_10,"//////////////////////////////////////////////\n");
    poVar6 = std::operator<<(local_10,"// BRA: ( ");
    pcVar1 = amchar;
    piVar7 = DAM::operator[]((DAM *)in_stack_ffffffffffffed20,in_stack_ffffffffffffed1c);
    poVar6 = std::operator<<(poVar6,pcVar1[*piVar7]);
    poVar6 = std::operator<<(poVar6," ");
    pcVar1 = amchar;
    piVar7 = DAM::operator[]((DAM *)in_stack_ffffffffffffed20,in_stack_ffffffffffffed1c);
    poVar6 = std::operator<<(poVar6,pcVar1[*piVar7]);
    std::operator<<(poVar6," |\n");
    poVar6 = std::operator<<(local_10,"// Steps: ");
    sVar5 = std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>::size(&local_110);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,sVar5);
    std::operator<<(poVar6,"\n");
    std::operator<<(local_10,"//////////////////////////////////////////////\n");
    std::operator<<(local_10,"\n");
    std::__cxx11::stringstream::stringstream(local_350);
    poVar6 = std::operator<<(local_340,"void HRR_");
    poVar6 = std::operator<<(poVar6,local_1c8);
    std::operator<<(poVar6,"_");
    pcVar1 = amchar;
    piVar7 = DAM::operator[]((DAM *)in_stack_ffffffffffffed20,in_stack_ffffffffffffed1c);
    poVar6 = std::operator<<(local_340,pcVar1[*piVar7]);
    poVar6 = std::operator<<(poVar6,"_");
    pcVar1 = amchar;
    piVar7 = DAM::operator[]((DAM *)in_stack_ffffffffffffed20,in_stack_ffffffffffffed1c);
    poVar6 = std::operator<<(poVar6,pcVar1[*piVar7]);
    std::operator<<(poVar6,"(");
    poVar6 = std::operator<<(local_340,"double * const restrict ");
    QAM::operator[](in_stack_ffffffffffffed20,in_stack_ffffffffffffed1c);
    QAM::operator[](in_stack_ffffffffffffed20,in_stack_ffffffffffffed1c);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_390,"X_X",&local_391);
    HRRVarName(in_stack_ffffffffffffed7c,in_stack_ffffffffffffed78,
               (string *)in_stack_ffffffffffffed70);
    poVar6 = std::operator<<(poVar6,local_370);
    std::operator<<(poVar6,",\n");
    std::__cxx11::string::~string(local_370);
    std::__cxx11::string::~string(local_390);
    std::allocator<char>::~allocator((allocator<char> *)&local_391);
    DAM::DAM((DAM *)in_stack_ffffffffffffed20,
             (DAM *)CONCAT44(in_stack_ffffffffffffed1c,in_stack_ffffffffffffed18));
    OSTEI_HRR_Algorithm_Base::GetBraAMReq
              (in_stack_ffffffffffffed88,(DAM *)in_stack_ffffffffffffed80);
    DAM::~DAM((DAM *)0x1513ef);
    local_3a0 = local_3d0;
    local_400[0]._M_node =
         (_Base_ptr)
         std::set<DAM,_std::less<DAM>,_std::allocator<DAM>_>::begin
                   ((set<DAM,_std::less<DAM>,_std::allocator<DAM>_> *)
                    CONCAT44(in_stack_ffffffffffffed1c,in_stack_ffffffffffffed18));
    local_408._M_node =
         (_Base_ptr)
         std::set<DAM,_std::less<DAM>,_std::allocator<DAM>_>::end
                   ((set<DAM,_std::less<DAM>,_std::allocator<DAM>_> *)
                    CONCAT44(in_stack_ffffffffffffed1c,in_stack_ffffffffffffed18));
    while( true ) {
      bVar2 = std::operator!=(local_400,&local_408);
      if (!bVar2) break;
      local_410 = std::_Rb_tree_const_iterator<DAM>::operator*
                            ((_Rb_tree_const_iterator<DAM> *)0x1516aa);
      poVar6 = std::operator<<(local_340,(string *)indent5_abi_cxx11_);
      poVar6 = std::operator<<(poVar6,"double const * const restrict ");
      DAM::operator[]((DAM *)in_stack_ffffffffffffed20,in_stack_ffffffffffffed1c);
      DAM::operator[]((DAM *)in_stack_ffffffffffffed20,in_stack_ffffffffffffed1c);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_450,"X_X",&local_451);
      HRRVarName(in_stack_ffffffffffffed7c,in_stack_ffffffffffffed78,
                 (string *)in_stack_ffffffffffffed70);
      poVar6 = std::operator<<(poVar6,local_430);
      std::operator<<(poVar6,",\n");
      std::__cxx11::string::~string(local_430);
      std::__cxx11::string::~string(local_450);
      std::allocator<char>::~allocator((allocator<char> *)&local_451);
      std::_Rb_tree_const_iterator<DAM>::operator++
                ((_Rb_tree_const_iterator<DAM> *)in_stack_ffffffffffffed20);
    }
    std::set<DAM,_std::less<DAM>,_std::allocator<DAM>_>::~set
              ((set<DAM,_std::less<DAM>,_std::allocator<DAM>_> *)0x151453);
    poVar6 = std::operator<<(local_340,(string *)indent5_abi_cxx11_);
    std::operator<<(poVar6,"const double hAB[3], const int ncart_ket)");
    memcpy(local_498,&DAT_0017e3d0,0x3c);
    for (local_49c = 0; poVar6 = local_10, local_49c < 0xf; local_49c = local_49c + 1) {
      std::__cxx11::stringstream::stringstream(local_628);
      poVar6 = std::operator<<(local_618,"static void HRR_");
      poVar6 = std::operator<<(poVar6,local_1c8);
      std::operator<<(poVar6,"_");
      pcVar1 = amchar;
      piVar7 = DAM::operator[]((DAM *)in_stack_ffffffffffffed20,in_stack_ffffffffffffed1c);
      poVar6 = std::operator<<(local_618,pcVar1[*piVar7]);
      poVar6 = std::operator<<(poVar6,"_");
      pcVar1 = amchar;
      piVar7 = DAM::operator[]((DAM *)in_stack_ffffffffffffed20,in_stack_ffffffffffffed1c);
      poVar6 = std::operator<<(poVar6,pcVar1[*piVar7]);
      poVar6 = std::operator<<(poVar6,"_");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_498[local_49c]);
      std::operator<<(poVar6,"(");
      poVar6 = std::operator<<(local_618,"double * const restrict ");
      QAM::operator[](in_stack_ffffffffffffed20,in_stack_ffffffffffffed1c);
      QAM::operator[](in_stack_ffffffffffffed20,in_stack_ffffffffffffed1c);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_668,"X_X",&local_669);
      HRRVarName(in_stack_ffffffffffffed7c,in_stack_ffffffffffffed78,
                 (string *)in_stack_ffffffffffffed70);
      poVar6 = std::operator<<(poVar6,local_648);
      std::operator<<(poVar6,",\n");
      std::__cxx11::string::~string(local_648);
      std::__cxx11::string::~string(local_668);
      std::allocator<char>::~allocator((allocator<char> *)&local_669);
      DAM::DAM((DAM *)in_stack_ffffffffffffed20,
               (DAM *)CONCAT44(in_stack_ffffffffffffed1c,in_stack_ffffffffffffed18));
      OSTEI_HRR_Algorithm_Base::GetBraAMReq
                (in_stack_ffffffffffffed88,(DAM *)in_stack_ffffffffffffed80);
      DAM::~DAM((DAM *)0x151c19);
      local_678 = local_6a8;
      local_6d8[0]._M_node =
           (_Base_ptr)
           std::set<DAM,_std::less<DAM>,_std::allocator<DAM>_>::begin
                     ((set<DAM,_std::less<DAM>,_std::allocator<DAM>_> *)
                      CONCAT44(in_stack_ffffffffffffed1c,in_stack_ffffffffffffed18));
      local_6e0._M_node =
           (_Base_ptr)
           std::set<DAM,_std::less<DAM>,_std::allocator<DAM>_>::end
                     ((set<DAM,_std::less<DAM>,_std::allocator<DAM>_> *)
                      CONCAT44(in_stack_ffffffffffffed1c,in_stack_ffffffffffffed18));
      while( true ) {
        bVar2 = std::operator!=(local_6d8,&local_6e0);
        if (!bVar2) break;
        local_6e8 = std::_Rb_tree_const_iterator<DAM>::operator*
                              ((_Rb_tree_const_iterator<DAM> *)0x151d3a);
        poVar6 = std::operator<<(local_618,(string *)indent5_abi_cxx11_);
        poVar6 = std::operator<<(poVar6,"double const * const restrict ");
        DAM::operator[]((DAM *)in_stack_ffffffffffffed20,in_stack_ffffffffffffed1c);
        DAM::operator[]((DAM *)in_stack_ffffffffffffed20,in_stack_ffffffffffffed1c);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_728,"X_X",&local_729);
        HRRVarName(in_stack_ffffffffffffed7c,in_stack_ffffffffffffed78,
                   (string *)in_stack_ffffffffffffed70);
        poVar6 = std::operator<<(poVar6,local_708);
        std::operator<<(poVar6,",\n");
        std::__cxx11::string::~string(local_708);
        std::__cxx11::string::~string(local_728);
        std::allocator<char>::~allocator((allocator<char> *)&local_729);
        std::_Rb_tree_const_iterator<DAM>::operator++
                  ((_Rb_tree_const_iterator<DAM> *)in_stack_ffffffffffffed20);
      }
      std::set<DAM,_std::less<DAM>,_std::allocator<DAM>_>::~set
                ((set<DAM,_std::less<DAM>,_std::allocator<DAM>_> *)0x151c7d);
      poVar6 = std::operator<<(local_618,(string *)indent5_abi_cxx11_);
      std::operator<<(poVar6,"const double hAB[3])");
      poVar6 = local_10;
      std::__cxx11::stringstream::str();
      poVar6 = std::operator<<(poVar6,local_750);
      std::operator<<(poVar6,"\n");
      std::__cxx11::string::~string(local_750);
      std::operator<<(local_10,"{\n");
      poVar6 = std::operator<<(local_10,(string *)indent1_abi_cxx11_);
      std::operator<<(poVar6,"int iket;\n");
      std::operator<<(local_10,"\n");
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_770,"",&local_771);
      std::__cxx11::to_string((int)((ulong)in_stack_ffffffffffffed68 >> 0x20));
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_7b8,"X_X",&local_7b9);
      WriteBraSteps_(in_stack_ffffffffffffef00,in_stack_ffffffffffffeef8,
                     (HRRDoubletStepList *)in_stack_ffffffffffffeef0,
                     (string *)in_stack_ffffffffffffeee8,(string *)in_stack_ffffffffffffeee0,
                     (string *)in_stack_ffffffffffffeed8);
      std::__cxx11::string::~string(local_7b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_7b9);
      std::__cxx11::string::~string(local_798);
      std::__cxx11::string::~string(local_770);
      std::allocator<char>::~allocator((allocator<char> *)&local_771);
      std::operator<<(local_10,"\n");
      std::operator<<(local_10,"}\n");
      std::operator<<(local_10,"\n");
      std::operator<<(local_10,"\n");
      std::__cxx11::stringstream::~stringstream(local_628);
    }
    std::__cxx11::stringstream::str();
    poVar6 = std::operator<<(poVar6,local_7e0);
    std::operator<<(poVar6,"\n{\n");
    std::__cxx11::string::~string(local_7e0);
    poVar6 = std::operator<<(local_10,(string *)indent1_abi_cxx11_);
    std::operator<<(poVar6,"int done_brastep = 0;\n");
    for (local_7e4 = 0; RVar3 = (RRStepType)((ulong)in_stack_ffffffffffffed68 >> 0x20),
        local_7e4 < 0xf; local_7e4 = local_7e4 + 1) {
      poVar6 = std::operator<<(local_10,(string *)indent1_abi_cxx11_);
      poVar6 = std::operator<<(poVar6,"if (ncart_ket == ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_498[local_7e4]);
      std::operator<<(poVar6,")\n");
      poVar6 = std::operator<<(local_10,(string *)indent1_abi_cxx11_);
      std::operator<<(poVar6,"{\n");
      poVar6 = std::operator<<(local_10,(string *)indent1_abi_cxx11_);
      poVar6 = std::operator<<(poVar6,(string *)indent1_abi_cxx11_);
      poVar6 = std::operator<<(poVar6,"HRR_");
      poVar6 = std::operator<<(poVar6,local_1c8);
      poVar6 = std::operator<<(poVar6,"_");
      pcVar1 = amchar;
      piVar7 = DAM::operator[]((DAM *)in_stack_ffffffffffffed20,in_stack_ffffffffffffed1c);
      poVar6 = std::operator<<(poVar6,pcVar1[*piVar7]);
      std::operator<<(poVar6,"_");
      poVar6 = local_10;
      pcVar1 = amchar;
      piVar7 = DAM::operator[]((DAM *)in_stack_ffffffffffffed20,in_stack_ffffffffffffed1c);
      poVar6 = std::operator<<(poVar6,pcVar1[*piVar7]);
      poVar6 = std::operator<<(poVar6,"_");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_498[local_7e4]);
      std::operator<<(poVar6,"(");
      poVar6 = local_10;
      QAM::operator[](in_stack_ffffffffffffed20,in_stack_ffffffffffffed1c);
      QAM::operator[](in_stack_ffffffffffffed20,in_stack_ffffffffffffed1c);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_828,"X_X",&local_829);
      HRRVarName(in_stack_ffffffffffffed7c,in_stack_ffffffffffffed78,
                 (string *)in_stack_ffffffffffffed70);
      poVar6 = std::operator<<(poVar6,local_808);
      std::operator<<(poVar6,", ");
      std::__cxx11::string::~string(local_808);
      std::__cxx11::string::~string(local_828);
      std::allocator<char>::~allocator((allocator<char> *)&local_829);
      DAM::DAM((DAM *)in_stack_ffffffffffffed20,
               (DAM *)CONCAT44(in_stack_ffffffffffffed1c,in_stack_ffffffffffffed18));
      OSTEI_HRR_Algorithm_Base::GetBraAMReq
                (in_stack_ffffffffffffed88,(DAM *)in_stack_ffffffffffffed80);
      DAM::~DAM((DAM *)0x152717);
      local_838 = local_868;
      local_898[0]._M_node =
           (_Base_ptr)
           std::set<DAM,_std::less<DAM>,_std::allocator<DAM>_>::begin
                     ((set<DAM,_std::less<DAM>,_std::allocator<DAM>_> *)
                      CONCAT44(in_stack_ffffffffffffed1c,in_stack_ffffffffffffed18));
      local_8a0._M_node =
           (_Base_ptr)
           std::set<DAM,_std::less<DAM>,_std::allocator<DAM>_>::end
                     ((set<DAM,_std::less<DAM>,_std::allocator<DAM>_> *)
                      CONCAT44(in_stack_ffffffffffffed1c,in_stack_ffffffffffffed18));
      while( true ) {
        bVar2 = std::operator!=(local_898,&local_8a0);
        if (!bVar2) break;
        local_8a8 = std::_Rb_tree_const_iterator<DAM>::operator*
                              ((_Rb_tree_const_iterator<DAM> *)0x152845);
        poVar6 = local_10;
        DAM::operator[]((DAM *)in_stack_ffffffffffffed20,in_stack_ffffffffffffed1c);
        DAM::operator[]((DAM *)in_stack_ffffffffffffed20,in_stack_ffffffffffffed1c);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_8e8,"X_X",&local_8e9);
        HRRVarName(in_stack_ffffffffffffed7c,in_stack_ffffffffffffed78,
                   (string *)in_stack_ffffffffffffed70);
        in_stack_ffffffffffffef00 = (OSTEI_HRR_Writer *)std::operator<<(poVar6,local_8c8);
        std::operator<<((ostream *)in_stack_ffffffffffffef00,", ");
        std::__cxx11::string::~string(local_8c8);
        std::__cxx11::string::~string(local_8e8);
        std::allocator<char>::~allocator((allocator<char> *)&local_8e9);
        std::_Rb_tree_const_iterator<DAM>::operator++
                  ((_Rb_tree_const_iterator<DAM> *)in_stack_ffffffffffffed20);
      }
      std::set<DAM,_std::less<DAM>,_std::allocator<DAM>_>::~set
                ((set<DAM,_std::less<DAM>,_std::allocator<DAM>_> *)0x15277b);
      std::operator<<(local_10,"hAB);\n");
      in_stack_ffffffffffffeef8 = std::operator<<(local_10,(string *)indent1_abi_cxx11_);
      in_stack_ffffffffffffeef0 =
           std::operator<<(in_stack_ffffffffffffeef8,(string *)indent1_abi_cxx11_);
      std::operator<<(in_stack_ffffffffffffeef0,"done_brastep = 1;\n");
      in_stack_ffffffffffffeee8 = std::operator<<(local_10,(string *)indent1_abi_cxx11_);
      std::operator<<(in_stack_ffffffffffffeee8,"}\n\n");
    }
    in_stack_ffffffffffffeee0 = std::operator<<(local_10,(string *)indent1_abi_cxx11_);
    std::operator<<(in_stack_ffffffffffffeee0,"if (done_brastep == 0) \n");
    in_stack_ffffffffffffeed8 = std::operator<<(local_10,(string *)indent1_abi_cxx11_);
    std::operator<<(in_stack_ffffffffffffeed8,"{\n");
    poVar6 = std::operator<<(local_10,(string *)indent1_abi_cxx11_);
    poVar6 = std::operator<<(poVar6,(string *)indent1_abi_cxx11_);
    std::operator<<(poVar6,"int iket;\n");
    std::operator<<(local_10,"\n");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_910,"",&local_911);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_938,"ncart_ket",&local_939);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_960,"X_X",&local_961);
    WriteBraSteps_(in_stack_ffffffffffffef00,in_stack_ffffffffffffeef8,
                   (HRRDoubletStepList *)in_stack_ffffffffffffeef0,
                   (string *)in_stack_ffffffffffffeee8,(string *)in_stack_ffffffffffffeee0,
                   (string *)in_stack_ffffffffffffeed8);
    std::__cxx11::string::~string(local_960);
    std::allocator<char>::~allocator((allocator<char> *)&local_961);
    std::__cxx11::string::~string(local_938);
    std::allocator<char>::~allocator((allocator<char> *)&local_939);
    std::__cxx11::string::~string(local_910);
    std::allocator<char>::~allocator((allocator<char> *)&local_911);
    poVar6 = std::operator<<(local_10,(string *)indent1_abi_cxx11_);
    std::operator<<(poVar6,"}\n");
    std::operator<<(local_10,"\n");
    std::operator<<(local_10,"}\n");
    std::operator<<(local_10,"\n");
    std::operator<<(local_10,"\n");
    poVar6 = local_18;
    std::__cxx11::stringstream::str();
    poVar6 = std::operator<<(poVar6,local_988);
    std::operator<<(poVar6,";\n\n");
    std::__cxx11::string::~string(local_988);
    std::__cxx11::stringstream::~stringstream(local_350);
    std::__cxx11::string::~string(local_1c8);
  }
  sVar5 = std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>::size(local_150);
  if (sVar5 != 0) {
    DAM::DAM((DAM *)in_stack_ffffffffffffed20,
             (DAM *)CONCAT44(in_stack_ffffffffffffed1c,in_stack_ffffffffffffed18));
    RVar4 = OSTEI_HRR_Algorithm_Base::GetKetRRStep
                      (in_stack_ffffffffffffed80,
                       (DAM *)CONCAT44(in_stack_ffffffffffffed7c,in_stack_ffffffffffffed78));
    DAM::~DAM((DAM *)0x152f25);
    local_98c = RVar4;
    RRStepTypeToStr_abi_cxx11_(RVar3);
    std::operator<<(local_10,"//////////////////////////////////////////////\n");
    poVar6 = std::operator<<(local_10,"// KET: | ");
    pcVar1 = amchar;
    piVar7 = DAM::operator[]((DAM *)in_stack_ffffffffffffed20,in_stack_ffffffffffffed1c);
    poVar6 = std::operator<<(poVar6,pcVar1[*piVar7]);
    poVar6 = std::operator<<(poVar6," ");
    pcVar1 = amchar;
    piVar7 = DAM::operator[]((DAM *)in_stack_ffffffffffffed20,in_stack_ffffffffffffed1c);
    poVar6 = std::operator<<(poVar6,pcVar1[*piVar7]);
    std::operator<<(poVar6," )\n");
    poVar6 = std::operator<<(local_10,"// Steps: ");
    sVar5 = std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>::size(local_150);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,sVar5);
    std::operator<<(poVar6,"\n");
    std::operator<<(local_10,"//////////////////////////////////////////////\n");
    std::operator<<(local_10,"\n");
    std::__cxx11::stringstream::stringstream(local_b60);
    poVar6 = std::operator<<(local_b50,"void HRR_");
    poVar6 = std::operator<<(poVar6,local_9d8);
    std::operator<<(poVar6,"_");
    pcVar1 = amchar;
    piVar7 = DAM::operator[]((DAM *)in_stack_ffffffffffffed20,in_stack_ffffffffffffed1c);
    poVar6 = std::operator<<(local_b50,pcVar1[*piVar7]);
    poVar6 = std::operator<<(poVar6,"_");
    pcVar1 = amchar;
    piVar7 = DAM::operator[]((DAM *)in_stack_ffffffffffffed20,in_stack_ffffffffffffed1c);
    poVar6 = std::operator<<(poVar6,pcVar1[*piVar7]);
    std::operator<<(poVar6,"(");
    poVar6 = std::operator<<(local_b50,"double * const restrict ");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_ba0,"X_X",&local_ba1);
    QAM::operator[](in_stack_ffffffffffffed20,in_stack_ffffffffffffed1c);
    QAM::operator[](in_stack_ffffffffffffed20,in_stack_ffffffffffffed1c);
    HRRVarName((string *)CONCAT44(in_stack_ffffffffffffed7c,in_stack_ffffffffffffed78),
               (int)((ulong)in_stack_ffffffffffffed70 >> 0x20),(int)in_stack_ffffffffffffed70);
    poVar6 = std::operator<<(poVar6,local_b80);
    std::operator<<(poVar6,",\n");
    std::__cxx11::string::~string(local_b80);
    std::__cxx11::string::~string(local_ba0);
    std::allocator<char>::~allocator((allocator<char> *)&local_ba1);
    DAM::DAM((DAM *)in_stack_ffffffffffffed20,
             (DAM *)CONCAT44(in_stack_ffffffffffffed1c,in_stack_ffffffffffffed18));
    OSTEI_HRR_Algorithm_Base::GetKetAMReq
              (in_stack_ffffffffffffed88,(DAM *)in_stack_ffffffffffffed80);
    DAM::~DAM((DAM *)0x1533b1);
    local_bb0 = local_be0;
    local_c10[0]._M_node =
         (_Base_ptr)
         std::set<DAM,_std::less<DAM>,_std::allocator<DAM>_>::begin
                   ((set<DAM,_std::less<DAM>,_std::allocator<DAM>_> *)
                    CONCAT44(in_stack_ffffffffffffed1c,in_stack_ffffffffffffed18));
    local_c18._M_node =
         (_Base_ptr)
         std::set<DAM,_std::less<DAM>,_std::allocator<DAM>_>::end
                   ((set<DAM,_std::less<DAM>,_std::allocator<DAM>_> *)
                    CONCAT44(in_stack_ffffffffffffed1c,in_stack_ffffffffffffed18));
    while( true ) {
      bVar2 = std::operator!=(local_c10,&local_c18);
      if (!bVar2) break;
      local_c20 = std::_Rb_tree_const_iterator<DAM>::operator*
                            ((_Rb_tree_const_iterator<DAM> *)0x153511);
      poVar6 = std::operator<<(local_b50,(string *)indent5_abi_cxx11_);
      poVar6 = std::operator<<(poVar6,"double const * const restrict ");
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c60,"X_X",&local_c61);
      piVar7 = DAM::operator[]((DAM *)in_stack_ffffffffffffed20,in_stack_ffffffffffffed1c);
      iVar8 = *piVar7;
      DAM::operator[]((DAM *)in_stack_ffffffffffffed20,in_stack_ffffffffffffed1c);
      HRRVarName((string *)CONCAT44(iVar8,in_stack_ffffffffffffed78),
                 (int)((ulong)in_stack_ffffffffffffed70 >> 0x20),(int)in_stack_ffffffffffffed70);
      in_stack_ffffffffffffed70 = std::operator<<(poVar6,local_c40);
      std::operator<<(in_stack_ffffffffffffed70,",\n");
      std::__cxx11::string::~string(local_c40);
      std::__cxx11::string::~string(local_c60);
      std::allocator<char>::~allocator((allocator<char> *)&local_c61);
      std::_Rb_tree_const_iterator<DAM>::operator++
                ((_Rb_tree_const_iterator<DAM> *)in_stack_ffffffffffffed20);
    }
    std::set<DAM,_std::less<DAM>,_std::allocator<DAM>_>::~set
              ((set<DAM,_std::less<DAM>,_std::allocator<DAM>_> *)0x153415);
    poVar6 = std::operator<<(local_b50,(string *)indent5_abi_cxx11_);
    std::operator<<(poVar6,"const double hCD[3], const int ncart_bra)");
    poVar6 = local_10;
    std::__cxx11::stringstream::str();
    poVar6 = std::operator<<(poVar6,local_c88);
    std::operator<<(poVar6,"\n");
    std::__cxx11::string::~string(local_c88);
    std::operator<<(local_10,"{\n");
    poVar6 = std::operator<<(local_10,(string *)indent1_abi_cxx11_);
    std::operator<<(poVar6,"int ibra;\n");
    std::operator<<(local_10,"\n");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_ca8,"",&local_ca9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_cd0,"ncart_bra",&local_cd1);
    in_stack_ffffffffffffed30 = (DAM *)local_cf9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_cf9 + 1),"X_X",(allocator *)in_stack_ffffffffffffed30);
    WriteKetSteps_(in_stack_ffffffffffffef00,in_stack_ffffffffffffeef8,
                   (HRRDoubletStepList *)in_stack_ffffffffffffeef0,
                   (string *)in_stack_ffffffffffffeee8,(string *)in_stack_ffffffffffffeee0,
                   (string *)in_stack_ffffffffffffeed8);
    std::__cxx11::string::~string((string *)(local_cf9 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_cf9);
    std::__cxx11::string::~string(local_cd0);
    std::allocator<char>::~allocator((allocator<char> *)&local_cd1);
    std::__cxx11::string::~string(local_ca8);
    std::allocator<char>::~allocator((allocator<char> *)&local_ca9);
    std::operator<<(local_10,"\n");
    std::operator<<(local_10,"}\n");
    std::operator<<(local_10,"\n");
    std::operator<<(local_10,"\n");
    std::__cxx11::stringstream::str();
    poVar6 = std::operator<<(local_18,local_d20);
    std::operator<<(poVar6,";\n\n");
    std::__cxx11::string::~string(local_d20);
    std::__cxx11::stringstream::~stringstream(local_b60);
    std::__cxx11::string::~string(local_9d8);
  }
  std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>::~vector
            ((vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_> *)in_stack_ffffffffffffed30);
  std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>::~vector
            ((vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_> *)in_stack_ffffffffffffed30);
  DAM::~DAM((DAM *)0x153ad7);
  DAM::~DAM((DAM *)0x153ae4);
  QAM::~QAM((QAM *)0x153af1);
  return;
}

Assistant:

void OSTEI_HRR_Writer::WriteHRRFile(std::ostream & of, std::ostream & ofh) const
{
    QAM finalam = info_.FinalAM();
    DAM braam = {finalam[0], finalam[1]};
    DAM ketam = {finalam[2], finalam[3]};

    // only call the function for the last doublets
    HRRDoubletStepList brasteps = hrr_algo_.GetBraSteps(braam);
    HRRDoubletStepList ketsteps = hrr_algo_.GetKetSteps(ketam);

    if(brasteps.size() > 0)
    {
        RRStepType brasteptype = hrr_algo_.GetBraRRStep(braam);
        std::string steptypestr = RRStepTypeToStr(brasteptype);

        of << "//////////////////////////////////////////////\n";
        of << "// BRA: ( " << amchar[braam[0]] << " " << amchar[braam[1]] << " |\n";
        of << "// Steps: " << brasteps.size() << "\n";
        of << "//////////////////////////////////////////////\n";
        of << "\n";

        std::stringstream prototype;
        

        prototype << "void HRR_" << steptypestr << "_";
        prototype << amchar[braam[0]] << "_" << amchar[braam[1]] << "(";

        // pointer to result buffer
        prototype << "double * const restrict " << HRRVarName(finalam[0], finalam[1], "X_X") << ",\n";

        // pointer to requirements
        for(const auto & it : hrr_algo_.GetBraAMReq(braam))
            prototype << indent5 << "double const * const restrict " << HRRVarName(it[0], it[1], "X_X") << ",\n";

        prototype << indent5 << "const double hAB[3], const int ncart_ket)";

        // Create different functions for different ncart_ket values
        const int ncart_ket_vals[15] = {1, 3, 6, 10, 15, 21, 28, 36, 45, 55, 66, 78, 91, 105, 120};
        for (int ival = 0; ival < 15; ival++)
        {
            std::stringstream prototype_ncartket;
            prototype_ncartket << "static void HRR_" << steptypestr << "_";
            prototype_ncartket << amchar[braam[0]] << "_" << amchar[braam[1]] << "_" << ncart_ket_vals[ival] << "(";

            // pointer to result buffer
            prototype_ncartket << "double * const restrict " << HRRVarName(finalam[0], finalam[1], "X_X") << ",\n";

            // pointer to requirements
            for(const auto & it : hrr_algo_.GetBraAMReq(braam))
                prototype_ncartket << indent5 << "double const * const restrict " << HRRVarName(it[0], it[1], "X_X") << ",\n";

            prototype_ncartket << indent5 << "const double hAB[3])";
            
            of << prototype_ncartket.str() << "\n";
            of << "{\n";
            of << indent1 << "int iket;\n";
            of << "\n";
            
            WriteBraSteps_(of, brasteps, "", std::to_string(ncart_ket_vals[ival]), "X_X"); 
            
            of << "\n";
            of << "}\n";
            of << "\n";
            of << "\n";
        }
        
        
        of << prototype.str() << "\n{\n";  // Original function header
        
        // Wrapper for different ncart_ket value functions
        of << indent1 << "int done_brastep = 0;\n";
        for (int ival = 0; ival < 15; ival++)
        {
            of << indent1 << "if (ncart_ket == " << ncart_ket_vals[ival] << ")\n";
            of << indent1 << "{\n";
            
            // function name
            of << indent1 << indent1 << "HRR_" << steptypestr << "_" << amchar[braam[0]] << "_";
            of << amchar[braam[1]] << "_" << ncart_ket_vals[ival] << "(";
            
            // pointer to result buffer
            of << HRRVarName(finalam[0], finalam[1], "X_X") << ", ";
            
            // pointer to requirements
            for(const auto & it : hrr_algo_.GetBraAMReq(braam))
                of << HRRVarName(it[0], it[1], "X_X") << ", ";
            of << "hAB);\n";
            
            of << indent1 << indent1 << "done_brastep = 1;\n";
            
            of << indent1 << "}\n\n";
        }
        
        
        // General situtaion
        of << indent1 << "if (done_brastep == 0) \n";
        of << indent1 << "{\n";
        
        of << indent1 << indent1 << "int iket;\n";
        of << "\n";
        
        WriteBraSteps_(of, brasteps, "", "ncart_ket", "X_X"); 
        
        of << indent1 << "}\n";

        of << "\n";
        of << "}\n";
        of << "\n";
        of << "\n";


        // header
        ofh << prototype.str() << ";\n\n";

    }

    if(ketsteps.size() > 0)
    {
        RRStepType ketsteptype = hrr_algo_.GetKetRRStep(ketam);
        std::string steptypestr = RRStepTypeToStr(ketsteptype);

        of << "//////////////////////////////////////////////\n";
        of << "// KET: | " << amchar[ketam[0]] << " " << amchar[ketam[1]] << " )\n";
        of << "// Steps: " << ketsteps.size() << "\n";
        of << "//////////////////////////////////////////////\n";
        of << "\n";

        std::stringstream prototype;

        prototype << "void HRR_" << steptypestr << "_";
        prototype << amchar[ketam[0]] << "_" << amchar[ketam[1]] << "(";

        // pointer to result buffer
        prototype << "double * const restrict " << HRRVarName("X_X", finalam[2], finalam[3]) << ",\n";

        // pointer to requirements
        for(const auto & it : hrr_algo_.GetKetAMReq(ketam))
            prototype << indent5 << "double const * const restrict " << HRRVarName("X_X", it[0], it[1]) << ",\n";

        prototype << indent5 << "const double hCD[3], const int ncart_bra)";



        of << prototype.str() << "\n";
        of << "{\n";
        of << indent1 << "int ibra;\n";
        of << "\n";

        WriteKetSteps_(of, ketsteps, "", "ncart_bra", "X_X"); 

        of << "\n";
        of << "}\n";
        of << "\n";
        of << "\n";


        // header
        ofh << prototype.str() << ";\n\n";
    }
}